

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_ecdsa_anti_exfil_host_commit
              (secp256k1_context *ctx,uchar *rand_commitment32,uchar *rand32)

{
  void *pvVar1;
  char *pcVar2;
  secp256k1_sha256 sha;
  
  if (rand_commitment32 == (uchar *)0x0) {
    pvVar1 = (ctx->illegal_callback).data;
    pcVar2 = "rand_commitment32 != NULL";
  }
  else {
    if (rand32 != (uchar *)0x0) {
      secp256k1_s2c_ecdsa_data_sha256_tagged(&sha);
      secp256k1_sha256_write(&sha,rand32,0x20);
      secp256k1_sha256_finalize(&sha,rand_commitment32);
      return 1;
    }
    pvVar1 = (ctx->illegal_callback).data;
    pcVar2 = "rand32 != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar2,pvVar1);
  return 0;
}

Assistant:

int secp256k1_ecdsa_anti_exfil_host_commit(const secp256k1_context* ctx, unsigned char* rand_commitment32, const unsigned char* rand32) {
    secp256k1_sha256 sha;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(rand_commitment32 != NULL);
    ARG_CHECK(rand32 != NULL);

    secp256k1_s2c_ecdsa_data_sha256_tagged(&sha);
    secp256k1_sha256_write(&sha, rand32, 32);
    secp256k1_sha256_finalize(&sha, rand_commitment32);
    return 1;
}